

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_set_int(secp256k1_fe *r,int a)

{
  if (-1 < a) {
    r->n[0] = (ulong)(uint)a;
    r->n[1] = 0;
    r->n[2] = 0;
    r->n[3] = 0;
    r->n[4] = 0;
    r->magnitude = (uint)(a != 0);
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0xda,"test condition failed: 0 <= a && a <= 0x7FFF");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_set_int(secp256k1_fe *r, int a) {
    VERIFY_CHECK(0 <= a && a <= 0x7FFF);

    secp256k1_fe_impl_set_int(r, a);
    r->magnitude = (a != 0);
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}